

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQNativeClosure::Release(SQNativeClosure *this)

{
  SQUnsignedInteger SVar1;
  SQUnsignedInteger SVar2;
  SQInteger nl;
  long lVar3;
  long lVar4;
  
  SVar1 = this->_noutervalues;
  lVar4 = 0;
  SVar2 = SVar1;
  for (lVar3 = 0; lVar3 < (long)SVar2; lVar3 = lVar3 + 1) {
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar4));
    SVar2 = this->_noutervalues;
    lVar4 = lVar4 + 0x10;
  }
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_free(this,SVar1 * 0x10 + 0x80);
  return;
}

Assistant:

void Release(){
        SQInteger size = _CALC_NATVIVECLOSURE_SIZE(_noutervalues);
        _DESTRUCT_VECTOR(SQObjectPtr,_noutervalues,_outervalues);
        this->~SQNativeClosure();
        sq_free(this,size);
    }